

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

bool Rml::ElementUtilities::GetClippingRegion
               (Element *element,Rectanglei *out_clip_region,
               ClipMaskGeometryList *out_clip_mask_list,bool force_clip_self)

{
  Vector2<float> pos;
  Vector2f size;
  bool bVar1;
  Overflow OVar2;
  bool bVar3;
  ComputedValues *this;
  TransformState *this_00;
  ElementBackgroundBorder *this_01;
  float fVar4;
  float fVar5;
  Rectangle<int> RVar6;
  Rectangle<float> RVar7;
  Matrix4f *local_190;
  BoxArea local_178;
  bool local_172;
  bool local_171;
  Vector2Type local_170;
  Vector2Type local_168;
  Vector2Type local_160;
  undefined1 local_120 [8];
  Rectanglef element_region;
  Vector2f element_size;
  Vector2f element_offset;
  Vector2f local_a4;
  Vector2<float> local_9c;
  Vector2f absolute_offset;
  ClipMaskOperation clip_operation;
  Geometry *clip_geometry;
  bool has_border_radius;
  Matrix4f *transform;
  TransformState *transform_state;
  bool disable_scissor_clipping;
  bool has_clipping_content;
  BoxArea clip_area;
  Clip local_5d;
  int clip_number;
  bool clip_none;
  bool clip_always;
  ComputedValues *pCStack_58;
  bool clip_enabled;
  ComputedValues *clip_computed;
  undefined1 auStack_48 [7];
  bool force_clip_current_element;
  Rectanglef clip_region;
  Element *clipping_element;
  int num_ignored_clips;
  Clip target_element_clip;
  bool force_clip_self_local;
  ClipMaskGeometryList *out_clip_mask_list_local;
  Rectanglei *out_clip_region_local;
  Element *element_local;
  
  clipping_element._7_1_ = force_clip_self;
  _num_ignored_clips = out_clip_mask_list;
  this = Element::GetComputedValues(element);
  clipping_element._6_1_ = Style::ComputedValues::clip(this);
  bVar1 = Style::Clip::operator==((Clip *)((long)&clipping_element + 6),None);
  if ((bVar1) && ((clipping_element._7_1_ & 1) == 0)) {
    element_local._7_1_ = false;
  }
  else {
    clipping_element._0_4_ = Style::Clip::GetNumber((Clip *)((long)&clipping_element + 6));
    local_170 = (Vector2Type)element;
    if ((clipping_element._7_1_ & 1) == 0) {
      local_170 = (Vector2Type)Element::GetOffsetParent(element);
    }
    clip_region.p1 = local_170;
    RVar7 = Rectangle<float>::MakeInvalid();
    clip_region.p0 = RVar7.p1;
    _auStack_48 = RVar7.p0;
    for (; clip_region.p1 != (Vector2Type)0x0;
        clip_region.p1 = (Vector2Type)Element::GetOffsetParent((Element *)clip_region.p1)) {
      local_171 = (clipping_element._7_1_ & 1) != 0 && clip_region.p1 == (Vector2Type)element;
      clip_computed._7_1_ = local_171;
      pCStack_58 = Element::GetComputedValues((Element *)clip_region.p1);
      OVar2 = Style::ComputedValues::overflow_x(pCStack_58);
      local_172 = true;
      if (OVar2 == Visible) {
        OVar2 = Style::ComputedValues::overflow_y(pCStack_58);
        local_172 = OVar2 != Visible;
      }
      clip_number._3_1_ = local_172;
      clip_number._1_1_ = Style::ComputedValues::clip(pCStack_58);
      clip_number._2_1_ = Style::Clip::operator==((Clip *)((long)&clip_number + 1),Always);
      local_5d = Style::ComputedValues::clip(pCStack_58);
      clip_number._0_1_ = Style::Clip::operator==(&local_5d,None);
      has_clipping_content = (bool)Style::ComputedValues::clip(pCStack_58);
      clip_area = Style::Clip::GetNumber((Clip *)&has_clipping_content);
      if (((((clip_number._2_1_ & 1) != 0) || ((clip_number._3_1_ & 1) != 0)) &&
          ((int)clipping_element == 0)) || ((clip_computed._7_1_ & 1) != 0)) {
        if ((clip_computed._7_1_ & 1) == 0) {
          local_178 = Element::GetClipArea((Element *)clip_region.p1);
        }
        else {
          local_178 = Border;
        }
        bVar1 = true;
        if (((clip_number._2_1_ & 1) == 0) && (bVar1 = true, (clip_computed._7_1_ & 1) == 0)) {
          fVar4 = Element::GetClientWidth((Element *)clip_region.p1);
          fVar5 = Element::GetScrollWidth((Element *)clip_region.p1);
          bVar1 = true;
          if (fVar5 - 0.5 <= fVar4) {
            fVar4 = Element::GetClientHeight((Element *)clip_region.p1);
            fVar5 = Element::GetScrollHeight((Element *)clip_region.p1);
            bVar1 = fVar4 < fVar5 - 0.5;
          }
        }
        bVar3 = false;
        if (_num_ignored_clips != (ClipMaskGeometryList *)0x0) {
          this_00 = Element::GetTransformState((Element *)clip_region.p1);
          if (this_00 == (TransformState *)0x0) {
            local_190 = (Matrix4f *)0x0;
          }
          else {
            local_190 = TransformState::GetTransform(this_00);
          }
          fVar4 = Style::ComputedValues::border_top_left_radius(pCStack_58);
          bVar3 = true;
          if (fVar4 <= 0.0) {
            fVar4 = Style::ComputedValues::border_top_right_radius(pCStack_58);
            bVar3 = true;
            if (fVar4 <= 0.0) {
              fVar4 = Style::ComputedValues::border_bottom_right_radius(pCStack_58);
              bVar3 = true;
              if (fVar4 <= 0.0) {
                fVar4 = Style::ComputedValues::border_bottom_left_radius(pCStack_58);
                bVar3 = 0.0 < fVar4;
              }
            }
          }
          if ((bVar3) || ((local_190 != (Matrix4f *)0x0 && (bVar1)))) {
            this_01 = Element::GetElementBackgroundBorder((Element *)clip_region.p1);
            register0x00000000 =
                 ElementBackgroundBorder::GetClipGeometry
                           (this_01,(Element *)clip_region.p1,local_178);
            bVar3 = ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::
                    empty(_num_ignored_clips);
            absolute_offset.x = (float)((uint)!bVar3 * 2);
            local_a4 = Element::GetAbsoluteOffset((Element *)clip_region.p1,Border);
            local_9c = Vector2<float>::Round(&local_a4);
            element_offset.x = absolute_offset.x;
            ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::push_back
                      (_num_ignored_clips,(value_type *)&element_offset);
          }
          bVar3 = local_190 != (Matrix4f *)0x0;
        }
        if ((bVar1) && (!bVar3)) {
          element_size = Element::GetAbsoluteOffset((Element *)clip_region.p1,local_178);
          pos = Vector2<float>::Round(&element_size);
          Element::GetRenderBox
                    ((RenderBox *)&element_region.p1,(Element *)clip_region.p1,local_178,0);
          size = RenderBox::GetFillSize((RenderBox *)&element_region.p1);
          RVar7 = Rectangle<float>::FromPositionSize(pos,size);
          element_region.p0 = RVar7.p1;
          local_120 = (undefined1  [8])RVar7.p0;
          RVar7.p1 = clip_region.p0;
          RVar7.p0 = _auStack_48;
          RVar7 = Rectangle<float>::IntersectIfValid((Rectangle<float> *)local_120,RVar7);
          clip_region.p0 = RVar7.p1;
          _auStack_48 = RVar7.p0;
        }
      }
      if ((0 < (int)clipping_element) && ((clip_number._3_1_ & 1) != 0)) {
        clipping_element._0_4_ = (int)clipping_element + -1;
      }
      clipping_element._0_4_ = Math::Max<int>((int)clipping_element,clip_area);
      if (((byte)clip_number & 1) != 0) break;
    }
    bVar1 = Rectangle<float>::Valid((Rectangle<float> *)auStack_48);
    if (bVar1) {
      Math::SnapToPixelGrid((Rectanglef *)auStack_48);
      RVar6 = Rectangle::operator_cast_to_Rectangle((Rectangle *)auStack_48);
      local_168 = RVar6.p0;
      out_clip_region->p0 = local_168;
      local_160 = RVar6.p1;
      out_clip_region->p1 = local_160;
    }
    element_local._7_1_ = Rectangle<float>::Valid((Rectangle<float> *)auStack_48);
  }
  return element_local._7_1_;
}

Assistant:

bool ElementUtilities::GetClippingRegion(Element* element, Rectanglei& out_clip_region, ClipMaskGeometryList* out_clip_mask_list,
	bool force_clip_self)
{
	using Style::Clip;
	Clip target_element_clip = element->GetComputedValues().clip();
	if (target_element_clip == Clip::Type::None && !force_clip_self)
		return false;

	int num_ignored_clips = target_element_clip.GetNumber();

	// Search through the element's ancestors, finding all elements that clip their overflow and have overflow to clip.
	// For each that we find, we combine their clipping region with the existing clipping region, and so build up a
	// complete clipping region for the element.
	Element* clipping_element = (force_clip_self ? element : element->GetOffsetParent());

	Rectanglef clip_region = Rectanglef::MakeInvalid();

	while (clipping_element)
	{
		const bool force_clip_current_element = (force_clip_self && clipping_element == element);
		const ComputedValues& clip_computed = clipping_element->GetComputedValues();
		const bool clip_enabled = (clip_computed.overflow_x() != Style::Overflow::Visible || clip_computed.overflow_y() != Style::Overflow::Visible);
		const bool clip_always = (clip_computed.clip() == Clip::Type::Always);
		const bool clip_none = (clip_computed.clip() == Clip::Type::None);
		const int clip_number = clip_computed.clip().GetNumber();

		// Merge the existing clip region with the current clip region, unless we are ignoring clip regions.
		if (((clip_always || clip_enabled) && num_ignored_clips == 0) || force_clip_current_element)
		{
			const BoxArea clip_area = (force_clip_current_element ? BoxArea::Border : clipping_element->GetClipArea());
			const bool has_clipping_content =
				(clip_always || force_clip_current_element || clipping_element->GetClientWidth() < clipping_element->GetScrollWidth() - 0.5f ||
					clipping_element->GetClientHeight() < clipping_element->GetScrollHeight() - 0.5f);
			bool disable_scissor_clipping = false;

			if (out_clip_mask_list)
			{
				const TransformState* transform_state = clipping_element->GetTransformState();
				const Matrix4f* transform = (transform_state ? transform_state->GetTransform() : nullptr);
				const bool has_border_radius = (clip_computed.border_top_left_radius() > 0.f || clip_computed.border_top_right_radius() > 0.f ||
					clip_computed.border_bottom_right_radius() > 0.f || clip_computed.border_bottom_left_radius() > 0.f);

				// If the element has border-radius we always use a clip mask, since we can't easily predict if content is located on the curved
				// region to be clipped. If the element has a transform we only use a clip mask when the content clips.
				if (has_border_radius || (transform && has_clipping_content))
				{
					Geometry* clip_geometry = clipping_element->GetElementBackgroundBorder()->GetClipGeometry(clipping_element, clip_area);
					const ClipMaskOperation clip_operation = (out_clip_mask_list->empty() ? ClipMaskOperation::Set : ClipMaskOperation::Intersect);
					const Vector2f absolute_offset = clipping_element->GetAbsoluteOffset(BoxArea::Border).Round();
					out_clip_mask_list->push_back(ClipMaskGeometry{clip_operation, clip_geometry, absolute_offset, transform});
				}

				// If we only have border-radius then we add this element to the scissor region as well as the clip mask. This may help with e.g.
				// culling text render calls. However, when we have a transform, the element cannot be added to the scissor region since its geometry
				// may be projected entirely elsewhere.
				if (transform)
					disable_scissor_clipping = true;
			}

			if (has_clipping_content && !disable_scissor_clipping)
			{
				// Shrink the scissor region to the element's client area.
				Vector2f element_offset = clipping_element->GetAbsoluteOffset(clip_area).Round();
				Vector2f element_size = clipping_element->GetRenderBox(clip_area).GetFillSize();
				Rectanglef element_region = Rectanglef::FromPositionSize(element_offset, element_size);

				clip_region = element_region.IntersectIfValid(clip_region);
			}
		}

		// If this region is meant to clip and we're skipping regions, update the counter.
		if (num_ignored_clips > 0 && clip_enabled)
			num_ignored_clips--;

		// Inherit how many clip regions this ancestor ignores.
		num_ignored_clips = Math::Max(num_ignored_clips, clip_number);

		// If this region ignores all clipping regions, then we do too.
		if (clip_none)
			break;

		// Climb the tree to this region's parent.
		clipping_element = clipping_element->GetOffsetParent();
	}

	if (clip_region.Valid())
	{
		Math::SnapToPixelGrid(clip_region);
		out_clip_region = Rectanglei(clip_region);
	}

	return clip_region.Valid();
}